

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Input_.cxx
# Opt level: O1

void __thiscall Fl_Input_::put_in_buffer(Fl_Input_ *this,int len)

{
  char *pcVar1;
  char *__ptr;
  int iVar2;
  char *pcVar3;
  int iVar4;
  
  pcVar1 = this->value_;
  __ptr = this->buffer;
  iVar2 = this->bufsize;
  if (len < iVar2 && pcVar1 == __ptr) {
    __ptr[this->size_] = '\0';
    return;
  }
  if (iVar2 == 0) {
    iVar2 = len + 9;
    if (len <= this->size_) {
      iVar2 = len;
    }
    this->bufsize = iVar2 + 1;
    pcVar3 = (char *)malloc((long)(iVar2 + 1));
  }
  else {
    if (len < iVar2) goto LAB_001bc518;
    if (this->size_ < len) {
      iVar4 = this->bufsize;
      do {
        iVar4 = iVar4 * 2;
      } while (iVar4 <= len);
    }
    else {
      iVar4 = len + 1;
    }
    this->bufsize = iVar4;
    pcVar3 = (char *)realloc(__ptr,(long)iVar4);
    if (pcVar1 < __ptr + iVar2 && __ptr <= pcVar1) {
      this->value_ = this->value_ + ((long)pcVar3 - (long)this->buffer);
    }
  }
  this->buffer = pcVar3;
LAB_001bc518:
  memmove(this->buffer,this->value_,(long)this->size_);
  this->buffer[this->size_] = '\0';
  this->value_ = this->buffer;
  return;
}

Assistant:

void Fl_Input_::put_in_buffer(int len) {
  if (value_ == buffer && bufsize > len) {
    buffer[size_] = 0;
    return;
  }
  if (!bufsize) {
    if (len > size_) len += 9; // let a few characters insert before realloc
    bufsize = len+1; 
    buffer = (char*)malloc(bufsize);
  } else if (bufsize <= len) {
    // we may need to move old value in case it points into buffer:
    int moveit = (value_ >= buffer && value_ < buffer+bufsize);
    // enlarge current buffer
    if (len > size_) {
      do {bufsize *= 2;} while (bufsize <= len);
    } else {
      bufsize = len+1;
    }
    // Note: the following code is equivalent to:
    //
    //   if (moveit) value_ = value_ - buffer;
    //   char* nbuffer = (char*)realloc(buffer, bufsize);
    //   if (moveit) value_ = value_ + nbuffer;
    //   buffer = nbuffer;
    //
    // We just optimized the pointer arithmetic for value_...
    //
    char* nbuffer = (char*)realloc(buffer, bufsize);
    if (moveit) value_ += (nbuffer-buffer);
    buffer = nbuffer;
  }
  memmove(buffer, value_, size_); buffer[size_] = 0;
  value_ = buffer;
}